

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::simplify(Solver *this)

{
  CRef CVar1;
  
  reset_old_trail(this);
  if ((this->ok != true) || (CVar1 = propagate(this), CVar1 != 0xffffffff)) {
    this->ok = false;
    return false;
  }
  if ((this->trail).sz == this->simpDB_assigns) {
    return true;
  }
  if (0 < this->simpDB_props) {
    return true;
  }
  removeSatisfied(this,&this->learnts_core);
  safeRemoveSatisfied(this,&this->learnts_tier2,2);
  safeRemoveSatisfied(this,&this->learnts_local,0);
  if (this->remove_satisfied == true) {
    removeSatisfied(this,&this->clauses);
  }
  checkGarbage(this);
  rebuildOrderHeap(this);
  this->simpDB_assigns = (this->trail).sz;
  this->simpDB_props = this->learnts_literals + this->clauses_literals;
  return true;
}

Assistant:

bool Solver::simplify()
{
    TRACE(std::cout << "c run simplify on level " << decisionLevel() << std::endl);
    assert(decisionLevel() == 0);

    reset_old_trail();

    if (!ok || propagate() != CRef_Undef) return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0)) return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts_core); // Should clean core first.
    safeRemoveSatisfied(learnts_tier2, TIER2);
    safeRemoveSatisfied(learnts_local, LOCAL);
    if (remove_satisfied) // Can be turned off.
        removeSatisfied(clauses);
    checkGarbage();
    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props = clauses_literals + learnts_literals; // (shouldn't depend on stats really, but it will do for now)

    TRACE(std::cout << "c finished simplify on level " << decisionLevel() << std::endl);
    return true;
}